

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall
TasGrid::GridSequence::loadConstructedPoint
          (GridSequence *this,double *x,vector<double,_std::allocator<double>_> *y)

{
  pointer pdVar1;
  SimpleConstructData *pSVar2;
  bool bVar3;
  long lVar4;
  vector<int,_std::allocator<int>_> p;
  vector<double,_std::allocator<double>_> approx_value;
  vector<double,_std::allocator<double>_> surplus;
  vector<int,_std::allocator<int>_> scratch;
  allocator_type local_91;
  _Vector_base<int,_std::allocator<int>_> local_90;
  NodeData local_78;
  _Vector_base<double,_std::allocator<double>_> local_48;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  getMultiIndex((vector<int,_std::allocator<int>_> *)&local_90,this,x);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,
             (long)(this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&local_78);
  bVar3 = MultiIndexManipulations::isLowerComplete
                    ((vector<int,_std::allocator<int>_> *)&local_90,
                     &(this->super_BaseCanonicalGrid).points,
                     (vector<int,_std::allocator<int>_> *)&local_30);
  if (bVar3) {
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,
               (long)(this->super_BaseCanonicalGrid).num_outputs,(allocator_type *)&local_48);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,
               (long)(this->super_BaseCanonicalGrid).num_outputs,&local_91);
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x10])
                (this,x,local_78.point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      pdVar1 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar4 = 0;
          (double *)
          ((long)local_78.point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar4) !=
          (double *)
          local_78.point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish; lVar4 = lVar4 + 8) {
        *(double *)((long)local_48._M_impl.super__Vector_impl_data._M_start + lVar4) =
             *(double *)((long)pdVar1 + lVar4) -
             *(double *)
              ((long)local_78.point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar4);
      }
    }
    expandGrid(this,(vector<int,_std::allocator<int>_> *)&local_90,y,
               (vector<double,_std::allocator<double>_> *)&local_48);
    MultiIndexSet::removeIndex
              (&((this->dynamic_values)._M_t.
                 super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
                 .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
                initial_points,(vector<int,_std::allocator<int>_> *)&local_90);
    loadConstructedPoints(this);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_78);
  }
  else {
    pSVar2 = (this->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
             .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_78.point,(vector<int,_std::allocator<int>_> *)&local_90);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_78.value,(vector<double,_std::allocator<double>_> *)y);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              (&pSVar2->data,&local_78);
    NodeData::~NodeData(&local_78);
    MultiIndexSet::removeIndex
              (&((this->dynamic_values)._M_t.
                 super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
                 .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
                initial_points,(vector<int,_std::allocator<int>_> *)&local_90);
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
  return;
}

Assistant:

void GridSequence::loadConstructedPoint(const double x[], const std::vector<double> &y){
    std::vector<int> p = getMultiIndex(x);
    std::vector<int> scratch(num_dimensions);

    if (MultiIndexManipulations::isLowerComplete(p, points, scratch)){
        std::vector<double> approx_value(num_outputs), surplus(num_outputs);;
        if (!points.empty()){
            evaluate(x, approx_value.data());
            std::transform(approx_value.begin(), approx_value.end(), y.begin(), surplus.begin(), [&](double e, double v)->double{ return v - e; });
        }
        expandGrid(p, y, surplus);
        dynamic_values->initial_points.removeIndex(p);

        loadConstructedPoints(); // batch operation, if the new point has unleashed a bunch of previously available ones
    }else{
        dynamic_values->data.push_front({p, y});
        dynamic_values->initial_points.removeIndex(p);
    }
}